

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redirect.cpp
# Opt level: O2

int main(int argc,char **args)

{
  char *pcVar1;
  int iVar2;
  SAXParser *this;
  ostream *poVar3;
  ulong uVar4;
  RedirectHandlers handler;
  
  uVar4 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if ((argc == 2) && (pcVar1 = args[1], *pcVar1 != '-')) {
    this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,uVar4);
    xercesc_4_0::SAXParser::SAXParser
              (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    RedirectHandlers::RedirectHandlers(&handler);
    (**(code **)(*(long *)this + 0x20))(this,&handler.super_HandlerBase.super_DocumentHandler);
    (**(code **)(*(long *)this + 0x28))(this,&handler.super_HandlerBase.super_ErrorHandler);
    (**(code **)(*(long *)this + 0x50))(this,&handler.super_XMLEntityResolver);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (**(code **)(*(long *)this + 0x40))(this,pcVar1);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    iVar2 = xercesc_4_0::SAXParser::getErrorCount();
    if (iVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar1);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ms (");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," elems, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," attrs, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," spaces, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," chars)");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    (**(code **)(*(long *)this + 8))(this);
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar2 = (uint)(0 < iVar2) << 2;
    RedirectHandlers::~RedirectHandlers(&handler);
  }
  else {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* args[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // We only have one parameter, which is the file to process
    // We only have one required parameter, which is the file to process
    if ((argc != 2) || (*(args[1]) == '-'))
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    const char*              xmlFile = args[1];

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document, entity and error handlers.
    //
    RedirectHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);
    //Use the new XML Entity Resolver
    //parser->setEntityResolver(&handler);
    parser->setXMLEntityResolver(&handler);    

    //
    //  Get the starting time and kick off the parse of the indicated file.
    //  Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;
    int errorCount = 0;
    int errorCode = 0;
    try
    {
        const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
        parser->parse(xmlFile);
        const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
        duration = endMillis - startMillis;
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }

    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    // Print out the stats that we collected and time taken.
    if (!errorCount) {
        std::cout << xmlFile << ": " << duration << " ms ("
             << handler.getElementCount() << " elems, "
             << handler.getAttrCount() << " attrs, "
             << handler.getSpaceCount() << " spaces, "
             << handler.getCharacterCount() << " chars)" << std::endl;
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}